

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O1

void deqp::gls::calcShaderColorCoord<unsigned_int>
               (Vec2 *coord,Vec3 *color,Vector<unsigned_int,_4> *attribValue,bool isCoordinate,
               int numComponents)

{
  uint uVar1;
  uint uVar2;
  int i;
  long lVar3;
  undefined7 in_register_00000009;
  float fVar4;
  Vector<float,_3> res;
  
  if ((int)CONCAT71(in_register_00000009,isCoordinate) == 0) {
    switch(numComponents + -1) {
    case 0:
      uVar1 = attribValue->m_data[0];
      res.m_data[2] = 0.0;
      res.m_data[0] = 0.0;
      res.m_data[1] = 0.0;
      lVar3 = 0;
      do {
        res.m_data[lVar3] = color->m_data[lVar3] * (float)uVar1;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      color->m_data[2] = res.m_data[2];
      *(undefined8 *)color->m_data = res.m_data._0_8_;
      return;
    case 1:
      color->m_data[0] = (float)attribValue->m_data[0] * color->m_data[0];
      color->m_data[1] = (float)attribValue->m_data[1] * color->m_data[1];
      return;
    case 2:
      color->m_data[0] = (float)attribValue->m_data[0] * color->m_data[0];
      color->m_data[1] = (float)attribValue->m_data[1] * color->m_data[1];
      fVar4 = (float)attribValue->m_data[2] * color->m_data[2];
      break;
    case 3:
      fVar4 = (float)attribValue->m_data[3];
      color->m_data[0] = (float)attribValue->m_data[0] * color->m_data[0] * fVar4;
      color->m_data[1] = (float)attribValue->m_data[1] * color->m_data[1] * fVar4;
      fVar4 = (float)attribValue->m_data[2] * color->m_data[2] * fVar4;
      break;
    default:
      goto switchD_0095f84a_default;
    }
    color->m_data[2] = fVar4;
  }
  else {
    switch(numComponents + -1) {
    case 0:
      uVar1 = attribValue->m_data[0];
      coord->m_data[0] = (float)uVar1;
      coord->m_data[1] = (float)uVar1;
      return;
    case 1:
      uVar1 = attribValue->m_data[1];
      coord->m_data[0] = (float)attribValue->m_data[0];
      coord->m_data[1] = (float)uVar1;
      return;
    case 2:
      uVar1 = attribValue->m_data[1];
      coord->m_data[0] = (float)attribValue->m_data[2] + (float)attribValue->m_data[0];
      coord->m_data[1] = (float)uVar1;
      return;
    case 3:
      uVar1 = attribValue->m_data[1];
      uVar2 = attribValue->m_data[3];
      coord->m_data[0] = (float)attribValue->m_data[2] + (float)attribValue->m_data[0];
      coord->m_data[1] = (float)uVar2 + (float)uVar1;
      return;
    }
  }
switchD_0095f84a_default:
  return;
}

Assistant:

void calcShaderColorCoord (tcu::Vec2& coord, tcu::Vec3& color, const tcu::Vector<T, 4>& attribValue, bool isCoordinate, int numComponents)
{
	if (isCoordinate)
		switch (numComponents)
		{
			case 1:	coord = tcu::Vec2((float)attribValue.x(),							(float)attribValue.x());							break;
			case 2:	coord = tcu::Vec2((float)attribValue.x(),							(float)attribValue.y());							break;
			case 3:	coord = tcu::Vec2((float)attribValue.x() + (float)attribValue.z(),	(float)attribValue.y());							break;
			case 4:	coord = tcu::Vec2((float)attribValue.x() + (float)attribValue.z(),	(float)attribValue.y() + (float)attribValue.w());	break;

			default:
				DE_ASSERT(false);
		}
	else
	{
		switch (numComponents)
		{
			case 1:
				color = color * (float)attribValue.x();
				break;

			case 2:
				color.x() = color.x() * (float)attribValue.x();
				color.y() = color.y() * (float)attribValue.y();
				break;

			case 3:
				color.x() = color.x() * (float)attribValue.x();
				color.y() = color.y() * (float)attribValue.y();
				color.z() = color.z() * (float)attribValue.z();
				break;

			case 4:
				color.x() = color.x() * (float)attribValue.x() * (float)attribValue.w();
				color.y() = color.y() * (float)attribValue.y() * (float)attribValue.w();
				color.z() = color.z() * (float)attribValue.z() * (float)attribValue.w();
				break;

			default:
				DE_ASSERT(false);
		}
	}
}